

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic12::Run(UnitTest_semantic12 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  pointer *__ptr;
  long *local_58;
  string local_50;
  long *local_30;
  long *local_28;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = -(1 + 1)","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = -(1 + 1)\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = #{1, 2, 3}","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = #{1, 2, 3}\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = #\'str\'","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = #\'str\'\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = not a","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = not a\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = -a","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = -a\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = #a","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_58,&local_50);
  plVar2 = local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))(local_58);
  }
  local_58 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (plVar2 == (long *)0x0) {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"\'Semantic(\"a = #a\")\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = -\'str\'","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_28,&local_50);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "\'{ Semantic(\"a = -\'str\'\"); }\' has no luna::SemanticException","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"a = #1","");
  anon_unknown.dwarf_2f225::Semantic((anon_unknown_dwarf_2f225 *)&local_30,&local_50);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  local_30 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"\'{ Semantic(\"a = #1\"); }\' has no luna::SemanticException","");
  UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_CASE(semantic12)
{
    EXPECT_TRUE(Semantic("a = -(1 + 1)"));
    EXPECT_TRUE(Semantic("a = #{1, 2, 3}"));
    EXPECT_TRUE(Semantic("a = #'str'"));
    EXPECT_TRUE(Semantic("a = not a"));
    EXPECT_TRUE(Semantic("a = -a"));
    EXPECT_TRUE(Semantic("a = #a"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = -'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = #1");
    });
}